

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O1

void __thiscall
mp::BasicSuffix<double>::VisitValues<mp::internal::SuffixValueWriter>
          (BasicSuffix<double> *this,SuffixValueWriter *v)

{
  long lVar1;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  long lVar2;
  ArgList args;
  long local_58 [2];
  double local_48;
  
  lVar2 = (long)((this->super_SuffixBase).impl_)->num_values;
  if (0 < lVar2) {
    lVar1 = 0;
    do {
      local_48 = *(double *)((long)(((this->super_SuffixBase).impl_)->field_3).values + lVar1 * 8);
      if ((local_48 != 0.0) || (NAN(local_48))) {
        args.field_1.args_ = in_R8.args_;
        args.types_ = (uint64_t)local_58;
        local_58[0] = lVar1;
        fmt::print((fmt *)v->file_->file_,(FILE *)"{} {:.16}\n",(CStringRef)0x82,args);
      }
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  return;
}

Assistant:

int num_values() const { return impl_->num_values; }